

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O3

bool wallet::AllInputsMine(CWallet *wallet,CTransaction *tx,isminefilter *filter)

{
  pointer pCVar1;
  isminetype iVar2;
  bool bVar3;
  CTxIn *txin;
  pointer txin_00;
  long in_FS_OFFSET;
  bool bVar4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  unique_lock<std::recursive_mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_40);
  txin_00 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (txin_00 == pCVar1) {
    bVar3 = true;
  }
  else {
    do {
      iVar2 = InputIsMine(wallet,txin_00);
      bVar4 = (*filter & iVar2) == ISMINE_NO;
      bVar3 = !bVar4;
      if (bVar4) break;
      txin_00 = txin_00 + 1;
    } while (txin_00 != pCVar1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool AllInputsMine(const CWallet& wallet, const CTransaction& tx, const isminefilter& filter)
{
    LOCK(wallet.cs_wallet);
    for (const CTxIn& txin : tx.vin) {
        if (!(InputIsMine(wallet, txin) & filter)) return false;
    }
    return true;
}